

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fsm.cpp
# Opt level: O1

GdlRuleItem * __thiscall GdlRule::InputItem(GdlRule *this,int n)

{
  pointer ppGVar1;
  GdlRuleItem *pGVar2;
  long lVar3;
  long lVar4;
  
  ppGVar1 = (this->m_vprit).super__Vector_base<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  lVar3 = (long)(this->m_vprit).super__Vector_base<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)ppGVar1;
  if (lVar3 != 0) {
    lVar3 = lVar3 >> 3;
    lVar4 = 0;
    do {
      pGVar2 = ppGVar1[lVar4];
      if (pGVar2->m_nInputIndex == n) {
        return pGVar2;
      }
      lVar4 = lVar4 + 1;
    } while (lVar3 + (ulong)(lVar3 == 0) != lVar4);
  }
  return (GdlRuleItem *)0x0;
}

Assistant:

GdlRuleItem * GdlRule::InputItem(int n)
{
	for (size_t i = 0; i < m_vprit.size(); i++)
	{
		if (m_vprit[i]->m_nInputIndex == n)
			return m_vprit[i];
	}
	return NULL;
}